

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O2

Spl_Man_t * Spl_ManAlloc(Gia_Man_t *pGia,int Limit,int fReverse)

{
  int iVar1;
  Spl_Man_t *pSVar2;
  Vec_Bit_t *p;
  Vec_Bit_t *pVVar3;
  Vec_Int_t *pVVar4;
  Gia_Obj_t *pGVar5;
  Vec_Wec_t *pVVar6;
  int iVar7;
  
  pSVar2 = (Spl_Man_t *)calloc(1,0x70);
  pSVar2->pGia = pGia;
  pSVar2->Limit = Limit;
  pSVar2->fReverse = fReverse;
  p = Vec_BitStart(pGia->nObjs);
  pSVar2->vMarksCIO = p;
  pVVar3 = Vec_BitStart(pGia->nObjs);
  pSVar2->vMarksIn = pVVar3;
  pVVar3 = Vec_BitStart(pGia->nObjs);
  pSVar2->vMarksNo = pVVar3;
  pVVar3 = Vec_BitStart(pGia->nObjs);
  pSVar2->vMarksAnd = pVVar3;
  pVVar4 = Vec_IntAlloc(100);
  pSVar2->vRoots = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pSVar2->vNodes = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pSVar2->vLeaves = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pSVar2->vAnds = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pSVar2->vFanouts = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pSVar2->vCands = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pSVar2->vInputs = pVVar4;
  Vec_BitWriteEntry(p,0,1);
  for (iVar7 = 0; iVar7 < pGia->vCis->nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(pGia->vCis,iVar7);
    pGVar5 = Gia_ManObj(pGia,iVar1);
    iVar1 = Gia_ObjId(pGia,pGVar5);
    if (iVar1 == 0) break;
    Vec_BitWriteEntry(p,iVar1,1);
  }
  for (iVar7 = 0; iVar7 < pGia->vCos->nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(pGia->vCos,iVar7);
    pGVar5 = Gia_ManObj(pGia,iVar1);
    iVar1 = Gia_ObjId(pGia,pGVar5);
    if (iVar1 == 0) break;
    Vec_BitWriteEntry(p,iVar1,1);
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(pGia);
  Gia_ManSetLutRefs(pGia);
  if (pGia->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                  ,0x8c,"Spl_Man_t *Spl_ManAlloc(Gia_Man_t *, int, int)");
  }
  if (pGia->vMapping2 != (Vec_Wec_t *)0x0) {
    __assert_fail("!Gia_ManHasMapping2(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                  ,0x8d,"Spl_Man_t *Spl_ManAlloc(Gia_Man_t *, int, int)");
  }
  pVVar6 = Spl_ManToWecMapping(pGia);
  pGia->vMapping2 = pVVar6;
  pVVar4 = pGia->vMapping;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      pGia->vMapping->pArray = (int *)0x0;
      pVVar4 = pGia->vMapping;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_006436a1;
    }
    free(pVVar4);
    pGia->vMapping = (Vec_Int_t *)0x0;
  }
LAB_006436a1:
  Gia_ManStaticFanoutStart(pGia);
  return pSVar2;
}

Assistant:

Spl_Man_t * Spl_ManAlloc( Gia_Man_t * pGia, int Limit, int fReverse )
{
    int i, iObj;
    Spl_Man_t * p = ABC_CALLOC( Spl_Man_t, 1 );
    p->pGia       = pGia;
    p->Limit      = Limit;
    p->fReverse   = fReverse;
    // intermediate
    p->vMarksCIO  = Vec_BitStart( Gia_ManObjNum(pGia) );
    p->vMarksIn   = Vec_BitStart( Gia_ManObjNum(pGia) );
    p->vMarksNo   = Vec_BitStart( Gia_ManObjNum(pGia) );
    p->vMarksAnd  = Vec_BitStart( Gia_ManObjNum(pGia) );
    p->vRoots     = Vec_IntAlloc( 100 );
    p->vNodes     = Vec_IntAlloc( 100 );
    p->vLeaves    = Vec_IntAlloc( 100 );
    p->vAnds      = Vec_IntAlloc( 100 );
    // temporary 
    p->vFanouts   = Vec_IntAlloc( 100 );
    p->vCands     = Vec_IntAlloc( 100 );
    p->vInputs    = Vec_IntAlloc( 100 );
    // mark CIs/COs
    Vec_BitWriteEntry( p->vMarksCIO, 0, 1 );
    Gia_ManForEachCiId( pGia, iObj, i )
        Vec_BitWriteEntry( p->vMarksCIO, iObj, 1 );
    Gia_ManForEachCoId( pGia, iObj, i )
        Vec_BitWriteEntry( p->vMarksCIO, iObj, 1 );
    // mapping
    ABC_FREE( pGia->pRefs );
    Gia_ManCreateRefs( pGia );
    Gia_ManSetLutRefs( pGia );
    assert( Gia_ManHasMapping(pGia) );
    assert( !Gia_ManHasMapping2(pGia) );
    pGia->vMapping2 = Spl_ManToWecMapping( pGia );
    Vec_IntFreeP( &pGia->vMapping );
    // fanout
    Gia_ManStaticFanoutStart( pGia );
    return p;
}